

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

iterator __thiscall
QList<std::pair<QString,_QString>_>::begin(QList<std::pair<QString,_QString>_> *this)

{
  pair<QString,_QString> *n;
  QArrayDataPointer<std::pair<QString,_QString>_> *in_RDI;
  long in_FS_OFFSET;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  detach((QList<std::pair<QString,_QString>_> *)0x1424f9);
  QArrayDataPointer<std::pair<QString,_QString>_>::operator->(in_RDI);
  n = QArrayDataPointer<std::pair<QString,_QString>_>::begin
                ((QArrayDataPointer<std::pair<QString,_QString>_> *)0x14250a);
  iterator::iterator(&local_10,n);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)local_10.i;
  }
  __stack_chk_fail();
}

Assistant:

iterator begin() { detach(); return iterator(d->begin()); }